

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_keeper.h
# Opt level: O0

void __thiscall mp::ConstraintManager::ComputeViolations(ConstraintManager *this,SolCheck *chk)

{
  bool bVar1;
  reference this_00;
  undefined8 in_RSI;
  pair<const_double,_mp::BasicConstraintKeeper_&> *ck;
  iterator __end2;
  iterator __begin2;
  map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
  *__range2;
  map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [2];
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(local_20,&local_28);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>::
              operator*((_Rb_tree_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_> *)
                        0x1615f5);
    (*this_00->second->_vptr_BasicConstraintKeeper[0x24])(this_00->second,local_10);
    std::_Rb_tree_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_> *)this_00);
  }
  return;
}

Assistant:

void ComputeViolations(SolCheck& chk) {
    for (const auto& ck: con_keepers_)
      ck.second.ComputeViolations(chk);
  }